

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

bool __thiscall MinVR::VRMatrix4::operator==(VRMatrix4 *this,VRMatrix4 *m2)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0x10) break;
    uVar1 = uVar2 + 1;
  } while (ABS(m2->m[uVar2] - this->m[uVar2]) <= 1e-08);
  return 0xf < uVar2;
}

Assistant:

bool VRMatrix4::operator==(const VRMatrix4& m2) const {
  for (int i=0;i<16;i++) {
    if (fabs(m2.m[i] - m[i]) > VRMATH_EPSILON) {
      return false;
    }
  }
  return true;
}